

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O1

void __thiscall CNetAddr::SerializeV1Array(CNetAddr *this,uint8_t (*arr) [16])

{
  uint uVar1;
  long lVar2;
  CNetAddr *pCVar3;
  uint uVar4;
  ulong __n;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  switch(this->m_net) {
  case NET_UNROUTABLE:
  case NET_MAX:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.h"
                  ,0x15f,"void CNetAddr::SerializeV1Array(uint8_t (&)[16]) const");
  case NET_IPV4:
    uVar1 = (this->m_addr)._size;
    uVar4 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar4 = uVar1;
    }
    if (uVar4 != 4) {
      __assert_fail("prefix_size + m_addr.size() == sizeof(arr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.h"
                    ,0x14f,"void CNetAddr::SerializeV1Array(uint8_t (&)[16]) const");
    }
    *(uint8_t *)((long)arr + 8) = '\0';
    *(uint8_t *)((long)arr + 9) = '\0';
    *(uint8_t *)((long)arr + 10) = 0xff;
    *(uint8_t *)((long)arr + 0xb) = 0xff;
    *(uint8_t *)((long)arr + 0) = '\0';
    *(uint8_t *)((long)arr + 1) = '\0';
    *(uint8_t *)((long)arr + 2) = '\0';
    *(uint8_t *)((long)arr + 3) = '\0';
    *(uint8_t *)((long)arr + 4) = '\0';
    *(uint8_t *)((long)arr + 5) = '\0';
    *(uint8_t *)((long)arr + 6) = '\0';
    *(uint8_t *)((long)arr + 7) = '\0';
    uVar1 = (this->m_addr)._size;
    uVar4 = uVar1 - 0x11;
    pCVar3 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    if (uVar1 < 0x11) {
      uVar4 = uVar1;
      pCVar3 = this;
    }
    this = pCVar3;
    __n = (ulong)uVar4;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      arr = (uint8_t (*) [16])(*arr + 0xc);
LAB_00253bac:
      memcpy(arr,this,__n);
      return;
    }
    break;
  case NET_IPV6:
    uVar1 = (this->m_addr)._size;
    uVar4 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar4 = uVar1;
    }
    __n = (ulong)uVar4;
    if (uVar4 != 0x10) {
      __assert_fail("m_addr.size() == sizeof(arr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.h"
                    ,0x14a,"void CNetAddr::SerializeV1Array(uint8_t (&)[16]) const");
    }
    if (0x10 < uVar1) {
      this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) goto LAB_00253bac;
    break;
  default:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      *(uint8_t *)((long)arr + 0) = '\0';
      *(uint8_t *)((long)arr + 1) = '\0';
      *(uint8_t *)((long)arr + 2) = '\0';
      *(uint8_t *)((long)arr + 3) = '\0';
      *(uint8_t *)((long)arr + 4) = '\0';
      *(uint8_t *)((long)arr + 5) = '\0';
      *(uint8_t *)((long)arr + 6) = '\0';
      *(uint8_t *)((long)arr + 7) = '\0';
      *(uint8_t *)((long)arr + 8) = '\0';
      *(uint8_t *)((long)arr + 9) = '\0';
      *(uint8_t *)((long)arr + 10) = '\0';
      *(uint8_t *)((long)arr + 0xb) = '\0';
      *(uint8_t *)((long)arr + 0xc) = '\0';
      *(uint8_t *)((long)arr + 0xd) = '\0';
      *(uint8_t *)((long)arr + 0xe) = '\0';
      *(uint8_t *)((long)arr + 0xf) = '\0';
      return;
    }
    break;
  case NET_INTERNAL:
    uVar1 = (this->m_addr)._size;
    uVar4 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar4 = uVar1;
    }
    if (uVar4 != 10) {
      __assert_fail("prefix_size + m_addr.size() == sizeof(arr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.h"
                    ,0x155,"void CNetAddr::SerializeV1Array(uint8_t (&)[16]) const");
    }
    *(uint8_t *)((long)arr + 4) = 0x87;
    *(uint8_t *)((long)arr + 5) = '$';
    *(uint8_t *)((long)arr + 0) = 0xfd;
    *(uint8_t *)((long)arr + 1) = 'k';
    *(uint8_t *)((long)arr + 2) = 0x88;
    *(uint8_t *)((long)arr + 3) = 0xc0;
    uVar1 = (this->m_addr)._size;
    uVar4 = uVar1 - 0x11;
    pCVar3 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    if (uVar1 < 0x11) {
      uVar4 = uVar1;
      pCVar3 = this;
    }
    this = pCVar3;
    __n = (ulong)uVar4;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      arr = (uint8_t (*) [16])(*arr + 6);
      goto LAB_00253bac;
    }
  }
  __stack_chk_fail();
}

Assistant:

void SerializeV1Array(uint8_t (&arr)[V1_SERIALIZATION_SIZE]) const
    {
        size_t prefix_size;

        switch (m_net) {
        case NET_IPV6:
            assert(m_addr.size() == sizeof(arr));
            memcpy(arr, m_addr.data(), m_addr.size());
            return;
        case NET_IPV4:
            prefix_size = sizeof(IPV4_IN_IPV6_PREFIX);
            assert(prefix_size + m_addr.size() == sizeof(arr));
            memcpy(arr, IPV4_IN_IPV6_PREFIX.data(), prefix_size);
            memcpy(arr + prefix_size, m_addr.data(), m_addr.size());
            return;
        case NET_INTERNAL:
            prefix_size = sizeof(INTERNAL_IN_IPV6_PREFIX);
            assert(prefix_size + m_addr.size() == sizeof(arr));
            memcpy(arr, INTERNAL_IN_IPV6_PREFIX.data(), prefix_size);
            memcpy(arr + prefix_size, m_addr.data(), m_addr.size());
            return;
        case NET_ONION:
        case NET_I2P:
        case NET_CJDNS:
            break;
        case NET_UNROUTABLE:
        case NET_MAX:
            assert(false);
        } // no default case, so the compiler can warn about missing cases

        // Serialize ONION, I2P and CJDNS as all-zeros.
        memset(arr, 0x0, V1_SERIALIZATION_SIZE);
    }